

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

void __thiscall Code::generateMeasError(Code *this)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  uint in_EAX;
  int iVar4;
  iterator iVar5;
  result_type_conflict2 rVar6;
  int i;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar1 = *(int *)&(this->syndrome).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(this->syndrome).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  iVar4 = 0;
  do {
    if (iVar1 - iVar2 <= iVar4) {
      return;
    }
    if (this->boundaries == true) {
      iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&(this->syndromeIndices)._M_t,(key_type *)((long)&uStack_38 + 4));
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(this->syndromeIndices)._M_t._M_impl.super__Rb_tree_header) goto LAB_00111a77;
    }
    else {
LAB_00111a77:
      rVar6 = std::uniform_real_distribution<double>::operator()
                        (&this->distDouble0To1,&this->rnEngine);
      if (rVar6 <= this->q) {
        pcVar3 = (this->syndrome).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar3[uStack_38._4_4_] = (char)((int)(short)(pcVar3[uStack_38._4_4_] + 1) % 2);
      }
    }
    iVar4 = uStack_38._4_4_ + 1;
    uStack_38 = CONCAT44(iVar4,(undefined4)uStack_38);
  } while( true );
}

Assistant:

void Code::generateMeasError()
{
    for (int i = 0, imax = syndrome.size() ; i < imax; ++i)
    {
        if (boundaries)
        {
            auto it = syndromeIndices.find(i);
            if (it == syndromeIndices.end())
            {
                continue;
            }
        }
        if (distDouble0To1(rnEngine) <= q)
        {
            syndrome[i] = (syndrome[i] + 1) % 2;
        }
    }
}